

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O0

int mpt_connection_dispatch(mpt_connection *con,mpt_event_handler_t cmd,void *arg)

{
  byte bVar1;
  byte bVar2;
  mpt_stream *srm;
  mpt_buffer *pmVar3;
  ushort uVar4;
  int iVar5;
  mpt_buffer *pmVar6;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar7;
  int local_10c;
  byte local_105;
  mpt_msgtype hdr;
  uint8_t i;
  int ret;
  mpt_reply_data *rd;
  mpt_reply_context *rc;
  mpt_metatype *ctx;
  undefined8 uStack_e0;
  int len;
  uint64_t id;
  mpt_command *ans;
  mpt_message msg_2;
  mpt_message msg_1;
  _streamWrapper sw;
  uint8_t slen;
  uint8_t ilen;
  uint16_t hlen;
  uint8_t *data;
  mpt_message msg;
  mpt_event ev;
  mpt_buffer *buf;
  void *arg_local;
  mpt_event_handler_t cmd_local;
  mpt_connection *con_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  memset(&msg.clen,0,0x18);
  memset(&data,0,0x20);
  if (((con->out).state & 0x10) == 0) {
    if ((con->out).sock._id < 0) {
      srm = (mpt_stream *)(con->out).buf._buf;
      if (srm == (mpt_stream *)0x0) {
        con_local._4_4_ = -1;
      }
      else {
        con_local._4_4_ = mpt_stream_dispatch(srm,streamWrapper,&msg_1.clen);
      }
    }
    else if (((con->out).state & 0x20) == 0) {
      con_local._4_4_ = 0x10000;
    }
    else {
      (con->out).state = (con->out).state & 0xdf;
      pmVar3 = (con->out).buf._buf;
      if (pmVar3 == (mpt_buffer *)0x0) {
        if (cmd == (mpt_event_handler_t)0x0) {
          local_10c = 0;
        }
        else {
          local_10c = (*cmd)(arg,(mpt_event *)&msg.clen);
        }
        con_local._4_4_ = local_10c;
      }
      else {
        bVar1 = (con->out)._idlen;
        bVar2 = (con->out)._smax;
        uVar4 = (ushort)bVar1 + (ushort)bVar2;
        if (pmVar3->_used < (ulong)uVar4) {
          mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%u < %u)","datagram too small",
                  uVar4,CONCAT44(uVar7,(int)pmVar3->_used));
          mpt_outdata_reply(&con->out,(ulong)bVar2,pmVar3 + 1,(mpt_message *)0x0);
          con_local._4_4_ = -2;
        }
        else if (cmd == (mpt_event_handler_t)0x0) {
          pmVar3->_used = 0;
          mpt_outdata_reply(&con->out,(ulong)uVar4,pmVar3 + 1,(mpt_message *)0x0);
          con_local._4_4_ = 0;
        }
        else {
          pmVar6 = pmVar3 + 1;
          if (bVar1 == 0) {
            memset(&msg_2.clen,0,0x20);
            msg_1.used = (long)&pmVar6->_vptr + (long)(int)(uint)uVar4;
            msg_2.clen = pmVar3->_used - (ulong)uVar4;
            con_local._4_4_ = (*cmd)(arg,(mpt_event *)&msg.clen);
          }
          else if (((ulong)pmVar6->_vptr & 0x80) == 0) {
            rc = (mpt_reply_context *)0x0;
            for (local_105 = 0; local_105 < bVar1; local_105 = local_105 + 1) {
              if (*(char *)((long)&pmVar6->_vptr + (ulong)local_105) != '\0') {
                rc = (mpt_reply_context *)con->_rctx;
                if ((mpt_metatype *)rc == (mpt_metatype *)0x0) {
                  rc = (mpt_reply_context *)mpt_reply_deferrable(uVar4,replyConnection,con);
                  if ((mpt_metatype *)rc == (mpt_metatype *)0x0) {
                    mpt_log(0,"mpt::connection::dispatch<mpt::output>",4,"%s: %s",
                            "dispatch incomplete","no context available");
                  }
                  else {
                    con->_rctx = (mpt_metatype *)rc;
                  }
                }
                break;
              }
            }
            if (rc != (mpt_reply_context *)0x0) {
              (*rc->_vptr->reply)(rc,(mpt_message *)0x8);
            }
            msg.clen = 0;
            msg.used = (long)&pmVar6->_vptr + (long)(int)(uint)uVar4;
            data = (uint8_t *)(pmVar3->_used - (ulong)uVar4);
            con_local._4_4_ = (*cmd)(arg,(mpt_event *)&msg.clen);
          }
          else {
            memset(&ans,0,0x20);
            *(byte *)&pmVar6->_vptr = *(byte *)&pmVar6->_vptr & 0x7f;
            iVar5 = mpt_message_buf2id((long)&pmVar6->_vptr + (long)(int)(uint)bVar2,bVar1,
                                       &stack0xffffffffffffff20);
            if (iVar5 < 0) {
              mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","bad message length",
                      bVar1);
              pmVar3->_used = (ulong)bVar2;
              con_local._4_4_ = -2;
            }
            else {
              id = mpt_command_get(&con->_wait,uStack_e0);
              if (id == 0) {
                mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s (lx)",
                        "reply processing failed","message not registered",uStack_e0);
                con_local._4_4_ = -0x11;
              }
              else {
                msg_2.used = (long)&pmVar6->_vptr + (long)(int)(uint)uVar4;
                ans = (mpt_command *)(pmVar3->_used - (ulong)uVar4);
                iVar5 = (**(code **)(id + 8))(*(undefined8 *)(id + 0x10),&ans);
                if (iVar5 < 0) {
                  mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)",
                          "reply processing failed",iVar5);
                  con_local._4_4_ = -0x11;
                }
                else {
                  con_local._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    con_local._4_4_ = 0x10000;
  }
  return con_local._4_4_;
}

Assistant:

extern int mpt_connection_dispatch(MPT_STRUCT(connection) *con, MPT_TYPE(event_handler) cmd, void *arg)
{
	static const char _func[] = "mpt::connection::dispatch<mpt::output>";
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
	uint8_t *data;
	uint16_t hlen;
	uint8_t ilen, slen;
	
	/* message transfer in progress */
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_EVENTFLAG(Retry);
	}
	if (!MPT_socket_active(&con->out.sock)) {
		struct _streamWrapper sw;
		
		if (!(buf = con->out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_dispatch((void *) buf, streamWrapper, &sw);
	}
	/* no new data present */
	if (!(con->out.state & MPT_OUTFLAG(Received))) {
		return MPT_EVENTFLAG(Retry);
	}
	con->out.state &= ~MPT_OUTFLAG(Received);
	
	/* no message data */
	if (!(buf = con->out.buf._buf)) {
		return cmd ? cmd(arg, &ev) : 0;
	}
	ilen = con->out._idlen;
	slen = con->out._smax;
	hlen = ilen + slen;
	
	if ((size_t) hlen > buf->_used) {
		mpt_log(0, _func, MPT_LOG(Error), "%s (%u < %u)", MPT_tr("datagram too small"), hlen, (int) buf->_used);
		mpt_outdata_reply(&con->out, slen, buf + 1, 0);
		return MPT_ERROR(BadValue);
	}
	/* discard existing message */
	if (!cmd) {
		buf->_used = 0;
		mpt_outdata_reply(&con->out, hlen, buf + 1, 0);
		return 0;
	}
	data = (void *) (buf + 1);
	/* no message id */
	if (!ilen) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		return cmd(arg, &ev);
	}
	/* got reply message */
	if (data[0] & 0x80) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		MPT_STRUCT(command) *ans;
		uint64_t id;
		int len;
		data[0] &= 0x7f;
		if ((len = mpt_message_buf2id(data + slen, ilen, &id)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message length"), (int) ilen);
			buf->_used = slen;
			return MPT_ERROR(BadValue);
		}
		if (!(ans = mpt_command_get(&con->_wait, id))) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s (" PRIx64 ")",
			        MPT_tr("reply processing failed"), MPT_tr("message not registered"), id);
			return MPT_ERROR(MissingBuffer);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		if ((len = ans->cmd(ans->arg, &msg)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("reply processing failed"), len);
			return MPT_ERROR(MissingBuffer);
		}
		return 0;
	}
	else {
		MPT_INTERFACE(metatype) *ctx = 0;
		MPT_INTERFACE(reply_context) *rc;
		MPT_STRUCT(reply_data) *rd;
		int ret;
		uint8_t i;
		
		/* need processing */
		for (i = 0; i < ilen; ++i) {
			if (!data[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if (!(ctx = mpt_reply_deferrable(hlen, replyConnection, con))) {
				mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
				        MPT_tr("dispatch incomplete"), MPT_tr("no context available"));
				break;
			}
			con->_rctx = ctx;
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, ilen, data) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		
		ret = cmd(arg, &ev);
		
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			msg.base = &hdr;
			msg.used = sizeof(hdr);
			msg.cont = 0;
			rc->_vptr->reply(rc, &msg);
		}
		return ret;
	}
}